

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

bool cimg_library::cimg::is_directory(char *path)

{
  int iVar1;
  stat st_buf;
  stat sStack_98;
  
  if ((path != (char *)0x0) && (*path != '\0')) {
    iVar1 = stat(path,&sStack_98);
    return (sStack_98.st_mode & 0xf000) == 0x4000 && iVar1 == 0;
  }
  return false;
}

Assistant:

inline bool is_directory(const char *const path) {
      if (!path || !*path) return false;
#if cimg_OS==1
      struct stat st_buf;
      return (!stat(path,&st_buf) && S_ISDIR(st_buf.st_mode));
#elif cimg_OS==2
      const unsigned int res = (unsigned int)GetFileAttributesA(path);
      return res==INVALID_FILE_ATTRIBUTES?false:(res&16);
#else
      return false;
#endif
    }